

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_collective.cpp
# Opt level: O0

void __thiscall MxxColl_ScattervConvenience_Test::TestBody(MxxColl_ScattervConvenience_Test *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  reference pvVar4;
  reference pvVar5;
  reference out;
  size_type sVar6;
  char *pcVar7;
  AssertHelper local_290;
  Message local_288;
  int local_27c;
  undefined1 local_278 [8];
  AssertionResult gtest_ar_6;
  int j_4;
  Message local_258;
  int local_250;
  int local_24c;
  undefined1 local_248 [8];
  AssertionResult gtest_ar_5;
  AssertHelper local_220;
  Message local_218;
  int local_20c;
  undefined1 local_208 [8];
  AssertionResult gtest_ar_4;
  int j_3;
  Message local_1e8;
  int local_1e0;
  int local_1dc;
  undefined1 local_1d8 [8];
  AssertionResult gtest_ar_3;
  vector<int,_std::allocator<int>_> local_1a8;
  AssertHelper local_190;
  Message local_188;
  int local_17c;
  undefined1 local_178 [8];
  AssertionResult gtest_ar_2;
  int j_2;
  Message local_158;
  int local_150;
  int local_14c;
  undefined1 local_148 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_118;
  Message local_110;
  int local_104;
  undefined1 local_100 [8];
  AssertionResult gtest_ar;
  MPI_Comm poStack_e8;
  int j_1;
  comm local_e0;
  vector<int,_std::allocator<int>_> local_c0;
  allocator<int> local_a1;
  undefined1 local_a0 [8];
  vector<int,_std::allocator<int>_> result;
  ulong local_80;
  size_t j;
  int i;
  undefined1 local_68 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> sizes;
  vector<int,_std::allocator<int>_> vec;
  undefined1 local_30 [8];
  comm c;
  MxxColl_ScattervConvenience_Test *this_local;
  
  vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)&ompi_mpi_comm_world;
  c._24_8_ = this;
  mxx::comm::comm((comm *)local_30,
                  (MPI_Comm *)
                  &vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                   ._M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             &sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_68);
  iVar2 = mxx::comm::rank((comm *)local_30);
  if (iVar2 == 0) {
    iVar2 = mxx::comm::size((comm *)local_30);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_68,(long)iVar2);
    for (j._0_4_ = 0; iVar2 = mxx::comm::size((comm *)local_30), (int)j < iVar2;
        j._0_4_ = (int)j + 1) {
      pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_68,
                          (long)(int)j);
      *pvVar4 = (long)((int)j + 1);
      for (local_80 = 0; local_80 < (ulong)(long)((int)j + 1); local_80 = local_80 + 1) {
        result.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_ = (int)local_80 * 0xd + (int)j * -0x17;
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)
                   &sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,
                   (value_type_conflict *)
                   ((long)&result.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage + 4));
      }
    }
  }
  iVar2 = mxx::comm::rank((comm *)local_30);
  std::allocator<int>::allocator(&local_a1);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_a0,(long)(iVar2 + 1),&local_a1);
  std::allocator<int>::~allocator(&local_a1);
  iVar2 = mxx::comm::rank((comm *)local_30);
  if (iVar2 == 0) {
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)
                        &sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage,0);
    out = std::vector<int,_std::allocator<int>_>::front
                    ((vector<int,_std::allocator<int>_> *)local_a0);
    iVar2 = mxx::comm::rank((comm *)local_30);
    mxx::scatterv<int>(pvVar5,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_68,out,
                       (long)(iVar2 + 1),0,(comm *)local_30);
  }
  else {
    iVar2 = mxx::comm::rank((comm *)local_30);
    poStack_e8 = (MPI_Comm)&ompi_mpi_comm_world;
    mxx::comm::comm(&local_e0,&stack0xffffffffffffff18);
    mxx::scatterv_recv<int>(&local_c0,(long)(iVar2 + 1),0,&local_e0);
    std::vector<int,_std::allocator<int>_>::operator=
              ((vector<int,_std::allocator<int>_> *)local_a0,&local_c0);
    std::vector<int,_std::allocator<int>_>::~vector(&local_c0);
    mxx::comm::~comm(&local_e0);
  }
  for (gtest_ar.message_.ptr_._4_4_ = 0; iVar2 = gtest_ar.message_.ptr_._4_4_,
      sVar6 = std::vector<int,_std::allocator<int>_>::size
                        ((vector<int,_std::allocator<int>_> *)local_a0), iVar2 < (int)sVar6;
      gtest_ar.message_.ptr_._4_4_ = gtest_ar.message_.ptr_._4_4_ + 1) {
    iVar2 = gtest_ar.message_.ptr_._4_4_ * 0xd;
    iVar3 = mxx::comm::rank((comm *)local_30);
    local_104 = iVar2 + iVar3 * -0x17;
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_a0,
                        (long)gtest_ar.message_.ptr_._4_4_);
    testing::internal::EqHelper<false>::Compare<int,int>
              ((EqHelper<false> *)local_100,"13*j+-23*c.rank()","result[j]",&local_104,pvVar5);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_100);
    if (!bVar1) {
      testing::Message::Message(&local_110);
      pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_100);
      testing::internal::AssertHelper::AssertHelper
                (&local_118,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/test/test_collective.cpp"
                 ,0xb0,pcVar7);
      testing::internal::AssertHelper::operator=(&local_118,&local_110);
      testing::internal::AssertHelper::~AssertHelper(&local_118);
      testing::Message::~Message(&local_110);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_100);
    if (!bVar1) goto LAB_001161e9;
  }
  pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)
                      &sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage,0);
  iVar2 = mxx::comm::rank((comm *)local_30);
  mxx::scatterv<int>((vector<int,_std::allocator<int>_> *)&gtest_ar_1.message_,pvVar5,
                     (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_68,
                     (long)(iVar2 + 1),0,(comm *)local_30);
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)local_a0,
             (vector<int,_std::allocator<int>_> *)&gtest_ar_1.message_);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)&gtest_ar_1.message_);
  local_14c = mxx::comm::rank((comm *)local_30);
  local_14c = local_14c + 1;
  sVar6 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)local_a0);
  local_150 = (int)sVar6;
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_148,"c.rank()+1","(int)result.size()",&local_14c,&local_150);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_148);
  if (!bVar1) {
    testing::Message::Message(&local_158);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_148);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffffea0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/test/test_collective.cpp"
               ,0xb5,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&stack0xfffffffffffffea0,&local_158);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffea0);
    testing::Message::~Message(&local_158);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_148);
  if (bVar1) {
    for (gtest_ar_2.message_.ptr_._4_4_ = 0; iVar2 = gtest_ar_2.message_.ptr_._4_4_,
        sVar6 = std::vector<int,_std::allocator<int>_>::size
                          ((vector<int,_std::allocator<int>_> *)local_a0), iVar2 < (int)sVar6;
        gtest_ar_2.message_.ptr_._4_4_ = gtest_ar_2.message_.ptr_._4_4_ + 1) {
      iVar2 = gtest_ar_2.message_.ptr_._4_4_ * 0xd;
      iVar3 = mxx::comm::rank((comm *)local_30);
      local_17c = iVar2 + iVar3 * -0x17;
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_a0,
                          (long)gtest_ar_2.message_.ptr_._4_4_);
      testing::internal::EqHelper<false>::Compare<int,int>
                ((EqHelper<false> *)local_178,"13*j-23*c.rank()","result[j]",&local_17c,pvVar5);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_178);
      if (!bVar1) {
        testing::Message::Message(&local_188);
        pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_178);
        testing::internal::AssertHelper::AssertHelper
                  (&local_190,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/test/test_collective.cpp"
                   ,0xb7,pcVar7);
        testing::internal::AssertHelper::operator=(&local_190,&local_188);
        testing::internal::AssertHelper::~AssertHelper(&local_190);
        testing::Message::~Message(&local_188);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_178);
      if (!bVar1) goto LAB_001161e9;
    }
    iVar2 = mxx::comm::rank((comm *)local_30);
    if (iVar2 == 0) {
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)
                          &sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage,0);
      iVar2 = mxx::comm::rank((comm *)local_30);
      mxx::scatterv<int>(&local_1a8,pvVar5,
                         (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_68,
                         (long)(iVar2 + 1),0,(comm *)local_30);
      std::vector<int,_std::allocator<int>_>::operator=
                ((vector<int,_std::allocator<int>_> *)local_a0,&local_1a8);
      std::vector<int,_std::allocator<int>_>::~vector(&local_1a8);
    }
    else {
      iVar2 = mxx::comm::rank((comm *)local_30);
      std::vector<int,_std::allocator<int>_>::resize
                ((vector<int,_std::allocator<int>_> *)local_a0,(long)(iVar2 + 1));
      pvVar5 = std::vector<int,_std::allocator<int>_>::front
                         ((vector<int,_std::allocator<int>_> *)local_a0);
      iVar2 = mxx::comm::rank((comm *)local_30);
      mxx::comm::comm((comm *)&gtest_ar_3.message_);
      mxx::scatterv_recv<int>(pvVar5,(long)(iVar2 + 1),0,(comm *)&gtest_ar_3.message_);
      mxx::comm::~comm((comm *)&gtest_ar_3.message_);
    }
    local_1dc = mxx::comm::rank((comm *)local_30);
    local_1dc = local_1dc + 1;
    sVar6 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)local_a0);
    local_1e0 = (int)sVar6;
    testing::internal::EqHelper<false>::Compare<int,int>
              ((EqHelper<false> *)local_1d8,"c.rank()+1","(int)result.size()",&local_1dc,&local_1e0)
    ;
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d8);
    if (!bVar1) {
      testing::Message::Message(&local_1e8);
      pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_1d8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xfffffffffffffe10,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/test/test_collective.cpp"
                 ,0xbf,pcVar7);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xfffffffffffffe10,&local_1e8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffe10);
      testing::Message::~Message(&local_1e8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d8);
    if (bVar1) {
      for (gtest_ar_4.message_.ptr_._4_4_ = 0; iVar2 = gtest_ar_4.message_.ptr_._4_4_,
          sVar6 = std::vector<int,_std::allocator<int>_>::size
                            ((vector<int,_std::allocator<int>_> *)local_a0), iVar2 < (int)sVar6;
          gtest_ar_4.message_.ptr_._4_4_ = gtest_ar_4.message_.ptr_._4_4_ + 1) {
        iVar2 = gtest_ar_4.message_.ptr_._4_4_ * 0xd;
        iVar3 = mxx::comm::rank((comm *)local_30);
        local_20c = iVar2 + iVar3 * -0x17;
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_a0,
                            (long)gtest_ar_4.message_.ptr_._4_4_);
        testing::internal::EqHelper<false>::Compare<int,int>
                  ((EqHelper<false> *)local_208,"13*j-23*c.rank()","result[j]",&local_20c,pvVar5);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_208);
        if (!bVar1) {
          testing::Message::Message(&local_218);
          pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_208);
          testing::internal::AssertHelper::AssertHelper
                    (&local_220,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/test/test_collective.cpp"
                     ,0xc1,pcVar7);
          testing::internal::AssertHelper::operator=(&local_220,&local_218);
          testing::internal::AssertHelper::~AssertHelper(&local_220);
          testing::Message::~Message(&local_218);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_208);
        if (!bVar1) goto LAB_001161e9;
      }
      iVar2 = mxx::comm::rank((comm *)local_30);
      mxx::scatterv<int>((vector<int,_std::allocator<int>_> *)&gtest_ar_5.message_,
                         (vector<int,_std::allocator<int>_> *)
                         &sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,
                         (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_68,
                         (long)(iVar2 + 1),0,(comm *)local_30);
      std::vector<int,_std::allocator<int>_>::operator=
                ((vector<int,_std::allocator<int>_> *)local_a0,
                 (vector<int,_std::allocator<int>_> *)&gtest_ar_5.message_);
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)&gtest_ar_5.message_);
      local_24c = mxx::comm::rank((comm *)local_30);
      local_24c = local_24c + 1;
      sVar6 = std::vector<int,_std::allocator<int>_>::size
                        ((vector<int,_std::allocator<int>_> *)local_a0);
      local_250 = (int)sVar6;
      testing::internal::EqHelper<false>::Compare<int,int>
                ((EqHelper<false> *)local_248,"c.rank()+1","(int)result.size()",&local_24c,
                 &local_250);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_248);
      if (!bVar1) {
        testing::Message::Message(&local_258);
        pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_248);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&stack0xfffffffffffffda0,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/test/test_collective.cpp"
                   ,0xc6,pcVar7);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&stack0xfffffffffffffda0,&local_258);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffda0);
        testing::Message::~Message(&local_258);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_248);
      if (bVar1) {
        for (gtest_ar_6.message_.ptr_._4_4_ = 0; iVar2 = gtest_ar_6.message_.ptr_._4_4_,
            sVar6 = std::vector<int,_std::allocator<int>_>::size
                              ((vector<int,_std::allocator<int>_> *)local_a0), iVar2 < (int)sVar6;
            gtest_ar_6.message_.ptr_._4_4_ = gtest_ar_6.message_.ptr_._4_4_ + 1) {
          iVar2 = gtest_ar_6.message_.ptr_._4_4_ * 0xd;
          iVar3 = mxx::comm::rank((comm *)local_30);
          local_27c = iVar2 + iVar3 * -0x17;
          pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)local_a0,
                              (long)gtest_ar_6.message_.ptr_._4_4_);
          testing::internal::EqHelper<false>::Compare<int,int>
                    ((EqHelper<false> *)local_278,"13*j-23*c.rank()","result[j]",&local_27c,pvVar5);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_278);
          if (!bVar1) {
            testing::Message::Message(&local_288);
            pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_278);
            testing::internal::AssertHelper::AssertHelper
                      (&local_290,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/test/test_collective.cpp"
                       ,200,pcVar7);
            testing::internal::AssertHelper::operator=(&local_290,&local_288);
            testing::internal::AssertHelper::~AssertHelper(&local_290);
            testing::Message::~Message(&local_288);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_278);
          if (!bVar1) break;
        }
      }
    }
  }
LAB_001161e9:
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_a0);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_68);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             &sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  mxx::comm::~comm((comm *)local_30);
  return;
}

Assistant:

TEST(MxxColl, ScattervConvenience) {
    mxx::comm c = MPI_COMM_WORLD;

    std::vector<int> vec;
    std::vector<size_t> sizes;

    // scatter from 0
    if (c.rank() == 0) {
        sizes.resize(c.size());
        for (int i = 0; i < c.size(); ++i) {
            sizes[i] = i+1;
            for (size_t j = 0; j < (size_t)(i+1); ++j)
            {
                vec.push_back(13*j + -23*i);
            }
        }
    }

    // test general case with recv
    std::vector<int> result(c.rank()+1);
    if (c.rank() == 0)
        mxx::scatterv(&vec[0], sizes, &result.front(), c.rank()+1, 0, c);
    else
        result = mxx::scatterv_recv<int>(c.rank()+1, 0, MPI_COMM_WORLD);
    for (int j = 0; j < (int)result.size(); ++j) {
        ASSERT_EQ(13*j+-23*c.rank(), result[j]);
    }

    // test convenience functions
    result = mxx::scatterv(&vec[0], sizes, c.rank()+1, 0, c);
    ASSERT_EQ(c.rank()+1, (int)result.size());
    for (int j = 0; j < (int)result.size(); ++j) {
        ASSERT_EQ(13*j-23*c.rank(), result[j]);
    }
    if (c.rank() == 0)
        result = mxx::scatterv(&vec[0], sizes, c.rank()+1, 0, c);
    else {
        result.resize(c.rank() + 1);
        mxx::scatterv_recv(&result.front(), c.rank()+1, 0);
    }
    ASSERT_EQ(c.rank()+1, (int)result.size());
    for (int j = 0; j < (int)result.size(); ++j) {
        ASSERT_EQ(13*j-23*c.rank(), result[j]);
    }

    // test convenience functions
    result = mxx::scatterv(vec, sizes, c.rank()+1, 0, c);
    ASSERT_EQ(c.rank()+1, (int)result.size());
    for (int j = 0; j < (int)result.size(); ++j) {
        ASSERT_EQ(13*j-23*c.rank(), result[j]);
    }
}